

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O2

int nn_bipc_create(void *hint,nn_epbase **epbase)

{
  nn_fsm_fn *self;
  nn_fsm *self_00;
  nn_ctx *ctx;
  char *pcVar1;
  undefined8 uStack_40;
  int reconnect_ivl_max;
  int reconnect_ivl;
  size_t local_28;
  
  self_00 = (nn_fsm *)nn_alloc_(0x3f0);
  if (self_00 == (nn_fsm *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/bipc.c"
            ,0x6e);
  }
  else {
    self = &self_00[1].shutdown_fn;
    nn_epbase_init((nn_epbase *)self,&nn_bipc_epbase_vfptr,hint);
    ctx = nn_epbase_getctx((nn_epbase *)self);
    nn_fsm_init_root(self_00,nn_bipc_handler,nn_bipc_shutdown,ctx);
    *(undefined4 *)&self_00[1].fn = 1;
    local_28 = 4;
    nn_epbase_getopt((nn_epbase *)self,0,6,&reconnect_ivl,&local_28);
    if (local_28 == 4) {
      nn_epbase_getopt((nn_epbase *)self,0,7,&reconnect_ivl_max,&local_28);
      if (local_28 == 4) {
        if (reconnect_ivl_max == 0) {
          reconnect_ivl_max = reconnect_ivl;
        }
        nn_backoff_init((nn_backoff *)&self_00[8].stopped.src,3,reconnect_ivl,reconnect_ivl_max,
                        self_00);
        nn_usock_init((nn_usock *)&self_00[1].srcptr,1,self_00);
        self_00[8].owner = (nn_fsm *)0x0;
        nn_list_init((nn_list *)&self_00[8].ctx);
        nn_fsm_start(self_00);
        *epbase = (nn_epbase *)self;
        return 0;
      }
      pcVar1 = "sz == sizeof (reconnect_ivl_max)";
      uStack_40 = 0x7c;
    }
    else {
      pcVar1 = "sz == sizeof (reconnect_ivl)";
      uStack_40 = 0x78;
    }
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/bipc.c"
            ,uStack_40);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_bipc_create (void *hint, struct nn_epbase **epbase)
{
    struct nn_bipc *self;
    int reconnect_ivl;
    int reconnect_ivl_max;
    size_t sz;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_bipc), "bipc");
    alloc_assert (self);

    /*  Initialise the structure. */
    nn_epbase_init (&self->epbase, &nn_bipc_epbase_vfptr, hint);
    nn_fsm_init_root (&self->fsm, nn_bipc_handler, nn_bipc_shutdown,
        nn_epbase_getctx (&self->epbase));
    self->state = NN_BIPC_STATE_IDLE;
    sz = sizeof (reconnect_ivl);
    nn_epbase_getopt (&self->epbase, NN_SOL_SOCKET, NN_RECONNECT_IVL,
        &reconnect_ivl, &sz);
    nn_assert (sz == sizeof (reconnect_ivl));
    sz = sizeof (reconnect_ivl_max);
    nn_epbase_getopt (&self->epbase, NN_SOL_SOCKET, NN_RECONNECT_IVL_MAX,
        &reconnect_ivl_max, &sz);
    nn_assert (sz == sizeof (reconnect_ivl_max));
    if (reconnect_ivl_max == 0)
        reconnect_ivl_max = reconnect_ivl;
    nn_backoff_init (&self->retry, NN_BIPC_SRC_RECONNECT_TIMER,
        reconnect_ivl, reconnect_ivl_max, &self->fsm);
    nn_usock_init (&self->usock, NN_BIPC_SRC_USOCK, &self->fsm);
    self->aipc = NULL;
    nn_list_init (&self->aipcs);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    /*  Return the base class as an out parameter. */
    *epbase = &self->epbase;

    return 0;
}